

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  stbi__uint16 sVar3;
  uint uVar4;
  stbi__uint16 *psVar5;
  undefined8 *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ushort *puVar10;
  long lVar11;
  ulong uVar12;
  ushort *puVar13;
  ulong uVar14;
  ulong uVar15;
  
  psVar5 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                    ,0x6b5,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar5 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar5 == (stbi__uint16 *)0x0) {
      free(data);
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_0012ce18);
      *puVar6 = "outofmem";
      psVar5 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar4 = req_comp + img_n * 8;
        if ((0x23 < uVar4) || ((0xe161a1c00U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                        ,0x6d2,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar1 = x - 1;
        uVar9 = 1;
        if (1 < (int)y) {
          uVar9 = (ulong)y;
        }
        uVar14 = 0;
        uVar15 = 0;
        uVar12 = 0;
        do {
          iVar7 = (int)uVar12 * x;
          puVar13 = data + (uint)(iVar7 * img_n);
          puVar10 = psVar5 + (uint)(iVar7 * req_comp);
          switch(uVar4) {
          case 10:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                psVar5[uVar15 + lVar11] = *(stbi__uint16 *)((long)data + lVar11 + uVar14 * 2);
                psVar5[uVar15 + lVar11 + 1] = 0xffff;
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 2;
              } while (0 < (int)uVar8);
            }
            break;
          case 0xb:
            if (-1 < iVar1) {
              puVar10 = psVar5 + uVar15 + 2;
              uVar8 = x;
              do {
                uVar2 = *puVar13;
                *puVar10 = uVar2;
                puVar10[-1] = uVar2;
                puVar10[-2] = uVar2;
                puVar13 = puVar13 + 1;
                uVar8 = uVar8 - 1;
                puVar10 = puVar10 + 3;
              } while (0 < (int)uVar8);
            }
            break;
          case 0xc:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                sVar3 = *(stbi__uint16 *)((long)data + lVar11 + uVar14 * 2);
                psVar5[uVar15 + lVar11 * 2 + 2] = sVar3;
                psVar5[uVar15 + lVar11 * 2 + 1] = sVar3;
                psVar5[uVar15 + lVar11 * 2] = sVar3;
                psVar5[uVar15 + lVar11 * 2 + 3] = 0xffff;
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 2;
              } while (0 < (int)uVar8);
            }
            break;
          default:
            uVar8 = x;
            if (-1 < iVar1) {
              do {
                *puVar10 = *puVar13;
                puVar10[1] = puVar13[1];
                puVar10[2] = puVar13[2];
                puVar13 = puVar13 + 4;
                puVar10 = puVar10 + 3;
                uVar8 = uVar8 - 1;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x11:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar15 * 2) = data[uVar14 + lVar11];
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 2;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x13:
            if (-1 < iVar1) {
              puVar10 = psVar5 + uVar15 + 2;
              uVar8 = x;
              do {
                uVar2 = *puVar13;
                *puVar10 = uVar2;
                puVar10[-1] = uVar2;
                puVar10[-2] = uVar2;
                puVar13 = puVar13 + 2;
                uVar8 = uVar8 - 1;
                puVar10 = puVar10 + 3;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x14:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                sVar3 = *(stbi__uint16 *)((long)data + lVar11 + uVar14 * 2);
                psVar5[uVar15 + lVar11 + 2] = sVar3;
                psVar5[uVar15 + lVar11 + 1] = sVar3;
                psVar5[uVar15 + lVar11] = sVar3;
                psVar5[uVar15 + lVar11 + 3] =
                     *(stbi__uint16 *)((long)data + lVar11 + uVar14 * 2 + 2);
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 4;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x19:
            uVar8 = x;
            if (-1 < iVar1) {
              do {
                uVar2 = puVar13[2];
                *puVar10 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                    (uint)puVar13[1] * 0x96 + (uint)*puVar13 * 0x4d >> 8);
                puVar13 = puVar13 + 3;
                puVar10 = puVar10 + 1;
                uVar8 = uVar8 - 1;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x1a:
            uVar8 = x;
            if (-1 < iVar1) {
              do {
                uVar2 = puVar13[2];
                *puVar10 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                    (uint)puVar13[1] * 0x96 + (uint)*puVar13 * 0x4d >> 8);
                puVar10[1] = 0xffff;
                puVar13 = puVar13 + 3;
                puVar10 = puVar10 + 2;
                uVar8 = uVar8 - 1;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x1c:
            uVar8 = x;
            if (-1 < iVar1) {
              do {
                *puVar10 = *puVar13;
                puVar10[1] = puVar13[1];
                puVar10[2] = puVar13[2];
                puVar10[3] = 0xffff;
                puVar13 = puVar13 + 3;
                puVar10 = puVar10 + 4;
                uVar8 = uVar8 - 1;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x21:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                uVar2 = data[uVar14 + lVar11 * 2 + 2];
                *(short *)((long)psVar5 + lVar11 + uVar15 * 2) =
                     (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                             (uint)data[uVar14 + lVar11 * 2 + 1] * 0x96 +
                             (uint)data[uVar14 + lVar11 * 2] * 0x4d >> 8);
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 2;
              } while (0 < (int)uVar8);
            }
            break;
          case 0x22:
            if (-1 < iVar1) {
              lVar11 = 0;
              uVar8 = x;
              do {
                uVar2 = data[uVar14 + lVar11 + 2];
                *(short *)((long)psVar5 + lVar11 + uVar15 * 2) =
                     (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                             (uint)data[uVar14 + lVar11 + 1] * 0x96 +
                             (uint)data[uVar14 + lVar11] * 0x4d >> 8);
                *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar15 * 2 + 2) =
                     data[uVar14 + lVar11 + 3];
                uVar8 = uVar8 - 1;
                lVar11 = lVar11 + 4;
              } while (0 < (int)uVar8);
            }
          }
          uVar12 = uVar12 + 1;
          uVar15 = (ulong)((int)uVar15 + req_comp * x);
          uVar14 = (ulong)((int)uVar14 + x * img_n);
        } while (uVar12 != uVar9);
      }
      free(data);
    }
  }
  return psVar5;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}